

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O2

void toggle_loadbang(t_toggle *x,t_floatarg action)

{
  t_pd *x_00;
  
  if (((action == 0.0) && (!NAN(action))) && (((uint)(x->x_gui).x_isa & 1) != 0)) {
    toggle_set(x,x->x_on);
    outlet_float((x->x_gui).x_obj.te_outlet,x->x_on);
    if ((((uint)(x->x_gui).x_fsf & 0x80) != 0) &&
       (x_00 = ((x->x_gui).x_snd)->s_thing, x_00 != (t_pd *)0x0)) {
      pd_float(x_00,x->x_on);
      return;
    }
  }
  return;
}

Assistant:

static void toggle_loadbang(t_toggle *x, t_floatarg action)
{
    if (action == LB_LOAD && x->x_gui.x_isa.x_loadinit)
        toggle_fout(x, (t_float)x->x_on);
}